

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseExpandRound2
              (sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit,int fOnOffSetLit)

{
  int iVar1;
  int *pLits;
  int nLits;
  int iLit;
  int i;
  int fOnOffSetLit_local;
  int nBTLimit_local;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSat_local;
  
  Vec_IntClear(vTemp);
  for (nLits = 0; iVar1 = Vec_IntSize(vLits), nLits < iVar1; nLits = nLits + 1) {
    iVar1 = Vec_IntEntry(vLits,nLits);
    if (iVar1 != -1) {
      Vec_IntPush(vTemp,iVar1);
    }
  }
  iVar1 = Vec_IntSize(vTemp);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x16c,
                  "int Bmc_CollapseExpandRound2(sat_solver *, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  if (-1 < fOnOffSetLit) {
    sat_solver_push(pSat,fOnOffSetLit);
  }
  pLits = Vec_IntArray(vTemp);
  iVar1 = Vec_IntSize(vTemp);
  iVar1 = sat_solver_minimize_assumptions(pSat,pLits,iVar1,nBTLimit);
  Vec_IntShrink(vTemp,iVar1);
  if (-1 < fOnOffSetLit) {
    sat_solver_pop(pSat);
  }
  for (nLits = 0; iVar1 = Vec_IntSize(vLits), nLits < iVar1; nLits = nLits + 1) {
    iVar1 = Vec_IntEntry(vLits,nLits);
    if ((iVar1 != -1) && (iVar1 = Vec_IntFind(vTemp,iVar1), iVar1 == -1)) {
      Vec_IntWriteEntry(vLits,nLits,-1);
    }
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpandRound2( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit, int fOnOffSetLit )
{
    // put into new array
    int i, iLit, nLits;
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 )
            Vec_IntPush( vTemp, iLit );
    assert( Vec_IntSize(vTemp) > 0 );
    // assume condition literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_push( pSat, fOnOffSetLit );
    // minimize
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTemp), Vec_IntSize(vTemp), nBTLimit );
    Vec_IntShrink( vTemp, nLits );
    // assume conditional literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_pop( pSat );
    // modify output literas
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 && Vec_IntFind(vTemp, iLit) == -1 )
            Vec_IntWriteEntry( vLits, i, -1 );
    return 0;
}